

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Vec_Int_t * Str_ManCreateRoots(Vec_Wec_t *vGroups,int nObjs)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  undefined4 local_30;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vGroup;
  Vec_Int_t *vRoots;
  int nObjs_local;
  Vec_Wec_t *vGroups_local;
  
  p = Vec_IntStartFull(nObjs);
  for (Entry = 0; iVar1 = Vec_WecSize(vGroups), Entry < iVar1; Entry = Entry + 1) {
    p_00 = Vec_WecEntry(vGroups,Entry);
    for (local_30 = 0; iVar1 = Vec_IntSize(p_00), local_30 < iVar1; local_30 = local_30 + 1) {
      iVar1 = Vec_IntEntry(p_00,local_30);
      Vec_IntWriteEntry(p,iVar1,Entry);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Str_ManCreateRoots( Vec_Wec_t * vGroups, int nObjs )
{   // map tree MUXes into their classes
    Vec_Int_t * vRoots;
    Vec_Int_t * vGroup;
    int i, k, Entry;
    vRoots = Vec_IntStartFull( nObjs );
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_IntForEachEntry( vGroup, Entry, k )
            Vec_IntWriteEntry( vRoots, Entry, i );
    return vRoots;
}